

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileBuffer.cpp
# Opt level: O0

int __thiscall FileBuffer::getBufferPosition(FileBuffer *this,int position)

{
  int segment_00;
  int local_30;
  int local_2c;
  int i;
  int highestSegment;
  int lowestSegment;
  int firstFreeSegment;
  int segment;
  int position_local;
  FileBuffer *this_local;
  
  segment_00 = getSegmentNumber(this,position);
  highestSegment = -1;
  i = -1;
  local_2c = -1;
  local_30 = 0;
  while( true ) {
    if (this->_segments <= local_30) {
      if (highestSegment == -1) {
        if (this->_loadedSegments[local_2c] < segment_00) {
          loadSegment(this,segment_00,i);
          this_local._4_4_ = i * this->_fileSegmentLength + position % this->_fileSegmentLength;
        }
        else if (segment_00 < this->_loadedSegments[i]) {
          loadSegment(this,segment_00,local_2c);
          this_local._4_4_ =
               local_2c * this->_fileSegmentLength + position % this->_fileSegmentLength;
        }
        else {
          printf(
                "Unexpected Error! No segment slot found to overwrite! This should never happen. Maybe zero or negative segment count?\n"
                );
          this_local._4_4_ = -1;
        }
      }
      else {
        loadSegment(this,segment_00,highestSegment);
        this_local._4_4_ =
             highestSegment * this->_fileSegmentLength + position % this->_fileSegmentLength;
      }
      return this_local._4_4_;
    }
    if ((this->_loadedSegments[local_30] == -1) && (highestSegment == -1)) {
      highestSegment = local_30;
    }
    if ((i == -1) || (this->_loadedSegments[local_30] < this->_loadedSegments[i])) {
      i = local_30;
    }
    if ((local_2c == -1) || (this->_loadedSegments[local_2c] < this->_loadedSegments[local_30])) {
      local_2c = local_30;
    }
    if (this->_loadedSegments[local_30] == segment_00) break;
    local_30 = local_30 + 1;
  }
  return local_30 * this->_fileSegmentLength + position % this->_fileSegmentLength;
}

Assistant:

int FileBuffer::getBufferPosition(int position) {
    int segment = getSegmentNumber(position);

    int firstFreeSegment = -1;
    int lowestSegment = -1;
    int highestSegment = -1;

    for (int i = 0; i < _segments; i++) {
        // get first free segment
        if (_loadedSegments[i] == -1 && firstFreeSegment == -1) {
            firstFreeSegment = i;
        }

        // get lowest segment
        if (lowestSegment == -1 || _loadedSegments[i] < _loadedSegments[lowestSegment]) {
            lowestSegment = i;
        }

        // get highest segment
        if (highestSegment == -1 || _loadedSegments[i] > _loadedSegments[highestSegment]) {
            highestSegment = i;
        }

        // Segment already loaded, so just take it
        if (_loadedSegments[i] == segment) {
            return (i * _fileSegmentLength) + (position % _fileSegmentLength);
        }
    }

    //Segment not yet loaded:

    // take a free segment slot, if one is found
    if (firstFreeSegment != -1) {
        loadSegment(segment, firstFreeSegment);
        return (firstFreeSegment * _fileSegmentLength) + (position % _fileSegmentLength);
    }

    // overwrite the lowest segment slot, if segment number is higher than all loaded segments
    if (segment > _loadedSegments[highestSegment]) {
        loadSegment(segment, lowestSegment);
        return (lowestSegment * _fileSegmentLength) + (position % _fileSegmentLength);
    }

    // overwrite the highest segment slot, if segment number is lower than all loaded segments
    if (segment < _loadedSegments[lowestSegment]) {
        loadSegment(segment, highestSegment);
        return (highestSegment * _fileSegmentLength) + (position % _fileSegmentLength);
    }

    printf("Unexpected Error! No segment slot found to overwrite! This should never happen. Maybe zero or negative segment count?\n");
    return -1;
}